

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool mjs::anon_unknown_2::is_identifier_part_v3(int ch)

{
  classification cVar1;
  
  cVar1 = classify(ch);
  return (byte)(cVar1 - id_part) < 2;
}

Assistant:

constexpr bool is_identifier_part_v3(int ch) {
    switch (classify(ch)) {
    case unicode::classification::id_start:
    case unicode::classification::id_part:
        return true;
    default:
        return false;
    }
}